

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_factory.h
# Opt level: O2

shared_ptr<Shoes> __thiscall ProductRegistry::CreateLayer(ProductRegistry *this,ShoesParameter *p)

{
  CreatorRegistry *this_00;
  size_type sVar1;
  mapped_type *pp_Var2;
  ostream *poVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Shoes> sVar4;
  string type;
  string local_38 [32];
  
  std::__cxx11::string::string((string *)&type,(string *)&p->type);
  this_00 = Registry_abi_cxx11_();
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
          ::count(this_00,&type);
  if (sVar1 != 0) {
    pp_Var2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
              ::operator[](this_00,&type);
    (**pp_Var2)((ShoesParameter *)this);
    std::__cxx11::string::~string((string *)&type);
    sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Shoes>)sVar4.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Unknown shoes type: ");
  poVar3 = std::operator<<(poVar3,(string *)&type);
  poVar3 = std::operator<<(poVar3," (known shoes types: ");
  TypeListString_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_38);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_38);
  exit(100);
}

Assistant:

static shared_ptr<Shoes> CreateLayer(const ShoesParameter& p) {
        string type = p.type;
        CreatorRegistry &registry = Registry();
        if (registry.count(type) == 0) {
            cout << "Unknown shoes type: " << type << " (known shoes types: " << TypeListString() << ")"<<endl;
            exit(100);
        }
        return registry[type](p);
    }